

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall nonius::csv_reporter::do_suite_complete(csv_reporter *this)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar1;
  bool bVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  _Hash_node_base *p_Var5;
  long lVar6;
  string local_50;
  
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\ngenerating CSV report\n",0x17);
  }
  if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &(this->super_reporter).os;
    pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
    *(uint *)(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18) + 0x18) =
         *(uint *)(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
    if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
      *(undefined8 *)(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18) + 8) = 0xf;
      p_Var5 = (this->data)._M_h._M_before_begin._M_nxt;
      if (p_Var5 != (_Hash_node_base *)0x0) {
        bVar2 = true;
        do {
          if (!bVar2) {
            if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00140f1c;
            pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
            std::__ostream_insert<char,std::char_traits<char>>(pbVar3,",",1);
          }
          if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_00140f1c;
          pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"\"",1);
          escape(&local_50,(string *)(p_Var5 + 1));
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (pbVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          p_Var5 = p_Var5->_M_nxt;
          bVar2 = false;
        } while (p_Var5 != (_Hash_node_base *)0x0);
      }
      if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
        pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
        std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"\n",1);
        if (0 < this->n_samples) {
          lVar6 = 0;
          do {
            p_Var5 = (this->data)._M_h._M_before_begin._M_nxt;
            if (p_Var5 != (_Hash_node_base *)0x0) {
              bVar2 = true;
              do {
                if (!bVar2) {
                  if ((this->super_reporter).os.super__Function_base._M_manager ==
                      (_Manager_type)0x0) goto LAB_00140f1c;
                  pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,",",1);
                }
                if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
                goto LAB_00140f1c;
                (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
                std::ostream::_M_insert<double>((double)p_Var5[5]._M_nxt[lVar6]._M_nxt);
                p_Var5 = p_Var5->_M_nxt;
                bVar2 = false;
              } while (p_Var5 != (_Hash_node_base *)0x0);
            }
            if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_00140f1c;
            pbVar3 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
            std::__ostream_insert<char,std::char_traits<char>>(pbVar3,"\n",1);
            lVar6 = lVar6 + 1;
          } while (lVar6 < this->n_samples);
        }
        if (this->verbose != false) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done\n",5);
        }
        return;
      }
    }
  }
LAB_00140f1c:
  std::__throw_bad_function_call();
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating CSV report\n";
            report_stream() << std::fixed;
            report_stream().precision(std::numeric_limits<double>::digits10);
            bool first = true;
            for(auto&& kv : data) {
                if(!first) report_stream() << ",";
                report_stream() << "\"" << escape(kv.first) << "\""; // TODO escape
                first = false;
            }
            report_stream() << "\n";
            for(int i = 0; i < n_samples; ++i) {
                first = true;
                for(auto&& kv : data) {
                    if(!first) report_stream() << ",";
                    report_stream() << kv.second[i].count();
                    first = false;
                }
                report_stream() << "\n";
            }
            if(verbose) progress_stream() << "done\n";
        }